

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_builder.hpp
# Opt level: O1

box_type * __thiscall
pico_tree::internal::
build_kd_tree<pico_tree::internal::kd_tree_data<pico_tree::internal::kd_tree_node_euclidean<int,float>,3ul>,3ul>
::
box_from_bounds<pico_tree::internal::space_wrapper<std::vector<std::array<float,3ul>,std::allocator<std::array<float,3ul>>>>,std::array<float,3ul>>
          (box_type *__return_storage_ptr__,void *this,
          space_wrapper<std::vector<std::array<float,_3UL>,_std::allocator<std::array<float,_3UL>_>_>_>
          space,bounds_t<std::array<float,_3UL>_> *bounds)

{
  float *pfVar1;
  float fVar2;
  long lVar3;
  
  lVar3 = -0xc;
  do {
    *(undefined4 *)((long)(__return_storage_ptr__->storage_).coords_max._M_elems + lVar3) =
         0x7f7fffff;
    *(undefined4 *)((long)__return_storage_ptr__[1].storage_.coords_min._M_elems + lVar3) =
         0xff7fffff;
    lVar3 = lVar3 + 4;
  } while (lVar3 != 0);
  lVar3 = 0;
  do {
    fVar2 = (bounds->min_)._M_elems[lVar3];
    if (fVar2 < (__return_storage_ptr__->storage_).coords_min._M_elems[lVar3]) {
      (__return_storage_ptr__->storage_).coords_min._M_elems[lVar3] = fVar2;
    }
    pfVar1 = (__return_storage_ptr__->storage_).coords_max._M_elems + lVar3;
    if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
      (__return_storage_ptr__->storage_).coords_max._M_elems[lVar3] = fVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  lVar3 = 0;
  do {
    fVar2 = (bounds->max_)._M_elems[lVar3];
    if (fVar2 < (__return_storage_ptr__->storage_).coords_min._M_elems[lVar3]) {
      (__return_storage_ptr__->storage_).coords_min._M_elems[lVar3] = fVar2;
    }
    pfVar1 = (__return_storage_ptr__->storage_).coords_max._M_elems + lVar3;
    if (*pfVar1 <= fVar2 && fVar2 != *pfVar1) {
      (__return_storage_ptr__->storage_).coords_max._M_elems[lVar3] = fVar2;
    }
    lVar3 = lVar3 + 1;
  } while (lVar3 != 3);
  return __return_storage_ptr__;
}

Assistant:

box_type box_from_bounds(
      SpaceWrapper_ space, bounds_t<Point_> const& bounds) const {
    internal::point_wrapper<Point_> min(bounds.min());
    internal::point_wrapper<Point_> max(bounds.max());
    box_type bbox = box_type::make_inverse_max(space.sdim());
    bbox.fit(min.begin());
    bbox.fit(max.begin());
    return bbox;
  }